

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

UdpBodySyntax * __thiscall slang::parsing::Parser::parseUdpBody(Parser *this,bool isSequential)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  UdpPortDeclSyntax *pUVar4;
  ExpressionSyntax *value;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UdpBodySyntax *pUVar5;
  EVP_PKEY_CTX *src;
  Token initial;
  Token table;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL> entries;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> portDecls;
  bool local_1a1;
  Info *local_1a0;
  UdpInitialStmtSyntax *local_198;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_190;
  long local_180;
  undefined1 local_178 [40];
  Info *local_150;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_148 [2];
  Token local_d0;
  Token local_c0;
  Token local_b0;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> local_a0;
  SyntaxList<slang::syntax::UdpEntrySyntax> local_68;
  
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 4;
  local_1a1 = isSequential;
  while( true ) {
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isPossibleUdpPort(TVar6.kind);
    if (!bVar1) break;
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    pUVar4 = parseUdpPortDecl(this,&local_1a1);
    local_190._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pUVar4;
    local_180._0_1_ = 1;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_148,(TokenOrSyntax *)&local_190._M_first);
    local_190._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)
         ParserBase::expect(&this->super_ParserBase,Semicolon);
    local_180 = (ulong)local_180._1_7_ << 8;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_148,(TokenOrSyntax *)&local_190._M_first);
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    if (TVar6.info == TVar7.info && TVar6.kind == TVar7.kind) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
    }
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,InitialKeyword);
  if (bVar1) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    local_1a0 = TVar6.info;
    local_198 = TVar6._0_8_;
    TVar6 = ParserBase::expect(&this->super_ParserBase,Identifier);
    TVar7 = ParserBase::expect(&this->super_ParserBase,Equals);
    value = parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    local_c0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    initial.info = local_1a0;
    initial._0_8_ = local_198;
    local_b0 = TVar7;
    local_198 = slang::syntax::SyntaxFactory::udpInitialStmt
                          (&this->factory,initial,TVar6,TVar7,value,local_c0);
  }
  else {
    local_198 = (UdpInitialStmtSyntax *)0x0;
  }
  TVar6 = ParserBase::expect(&this->super_ParserBase,TableKeyword);
  local_190._M_first._M_storage.info = (Info *)0x0;
  local_190._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_178;
  local_180 = 5;
  bVar1 = (bool)(local_1a1 & 1);
  while( true ) {
    local_150 = TVar6.info;
    local_1a0 = TVar6._0_8_;
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = slang::syntax::SyntaxFacts::isPossibleUdpEntry(TVar6.kind);
    if (!bVar2) break;
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)parseUdpEntry(this,bVar1);
    SmallVectorBase<slang::syntax::UdpEntrySyntax*>::emplace_back<slang::syntax::UdpEntrySyntax*>
              ((SmallVectorBase<slang::syntax::UdpEntrySyntax*> *)&local_190._M_first,
               (UdpEntrySyntax **)&local_a0);
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    TVar6.info = local_150;
    TVar6._0_8_ = local_1a0;
    if (TVar7.info == TVar8.info && TVar7.kind == TVar8.kind) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      TVar6.info = local_150;
      TVar6._0_8_ = local_1a0;
    }
  }
  TVar6 = ParserBase::expect(&this->super_ParserBase,EndTableKeyword);
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_148,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                     (EVP_PKEY_CTX *)TVar6.info);
  local_a0.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623f50;
  iVar3 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)&local_190._M_first,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_68.super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var_00,iVar3);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00624030;
  table.info = local_150;
  table._0_8_ = local_1a0;
  local_d0 = TVar6;
  pUVar5 = slang::syntax::SyntaxFactory::udpBody
                     (&this->factory,&local_a0,local_198,table,&local_68,TVar6);
  if (local_190._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_178) {
    operator_delete((void *)local_190._M_rest);
  }
  if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
    operator_delete(local_148[0].data_);
  }
  return pUVar5;
}

Assistant:

UdpBodySyntax& Parser::parseUdpBody(bool isSequential) {
    SmallVector<TokenOrSyntax, 4> portDecls;
    while (isPossibleUdpPort(peek().kind)) {
        auto current = peek();
        portDecls.push_back(&parseUdpPortDecl(isSequential));
        portDecls.push_back(expect(TokenKind::Semicolon));

        if (current == peek()) {
            // We didn't consume any tokens, so we're looking at
            // something invalid.
            skipToken({});
        }
    }

    UdpInitialStmtSyntax* initial = nullptr;
    if (peek(TokenKind::InitialKeyword)) {
        auto keyword = consume();
        auto name = expect(TokenKind::Identifier);
        auto equals = expect(TokenKind::Equals);
        auto& expr = parsePrimaryExpression(ExpressionOptions::None);
        auto semi = expect(TokenKind::Semicolon);
        initial = &factory.udpInitialStmt(keyword, name, equals, expr, semi);
    }

    auto table = expect(TokenKind::TableKeyword);

    SmallVector<UdpEntrySyntax*> entries;
    while (isPossibleUdpEntry(peek().kind)) {
        auto current = peek();
        entries.push_back(&parseUdpEntry(isSequential));

        if (current == peek()) {
            // We didn't consume any tokens, so we're looking at
            // something invalid.
            skipToken({});
        }
    }

    auto endtable = expect(TokenKind::EndTableKeyword);
    return factory.udpBody(portDecls.copy(alloc), initial, table, entries.copy(alloc), endtable);
}